

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quirrel_static_analyzer.cpp
# Opt level: O1

bool __thiscall Analyzer::isSubnodeExistsInNode(Analyzer *this,Node *node,Node *subnode)

{
  bool bVar1;
  pointer ppNVar2;
  ulong uVar3;
  bool bVar4;
  
  bVar1 = isNodeEquals(this,node,subnode);
  bVar4 = true;
  if (!bVar1) {
    ppNVar2 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    bVar4 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish != ppNVar2;
    if (bVar4) {
      uVar3 = 0;
      do {
        if ((ppNVar2[uVar3] != (Node *)0x0) &&
           (bVar1 = isSubnodeExistsInNode(this,ppNVar2[uVar3],subnode), bVar1)) {
          return bVar4;
        }
        uVar3 = uVar3 + 1;
        ppNVar2 = (node->children).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        bVar4 = uVar3 < (ulong)((long)(node->children).
                                      super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                                      super__Vector_impl_data._M_finish - (long)ppNVar2 >> 3);
      } while (bVar4);
    }
  }
  return bVar4;
}

Assistant:

bool isSubnodeExistsInNode(Node * node, Node * subnode)
  {
    if (isNodeEquals(node, subnode))
      return true;

    for (size_t i = 0; i < node->children.size(); i++)
      if (node->children[i])
        if (isSubnodeExistsInNode(node->children[i], subnode))
          return true;

    return false;
  }